

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall
Model_replaceImportedComponentByName_Test::~Model_replaceImportedComponentByName_Test
          (Model_replaceImportedComponentByName_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Model, replaceImportedComponentByName)
{
    auto model = libcellml::Model::create();
    auto myConcreteComponent1 = libcellml::Component::create("myConcreteComponent1");
    auto myImportedComponent1 = libcellml::Component::create("myImportedComponent1");
    auto myConcreteComponent2 = libcellml::Component::create("myConcreteComponent2");
    auto myImportedComponent2 = libcellml::Component::create("myImportedComponent2");

    auto import1 = libcellml::ImportSource::create();
    auto import2 = libcellml::ImportSource::create();

    import1->setUrl("import1.cellml");
    import2->setUrl("import2.cellml");

    myImportedComponent1->setImportSource(import1);
    myImportedComponent2->setImportSource(import2);

    model->addComponent(myConcreteComponent1);
    model->addComponent(myImportedComponent2);

    EXPECT_EQ(size_t(2), model->componentCount());

    // REPLACE concrete -> imported by name.
    EXPECT_TRUE(model->replaceComponent("myConcreteComponent1", myImportedComponent1));
    EXPECT_EQ(size_t(2), model->componentCount());

    // REPLACE imported -> concrete by name.
    EXPECT_TRUE(model->replaceComponent("myImportedComponent2", myConcreteComponent2));
    EXPECT_EQ(size_t(2), model->componentCount());
}